

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_char_*> * __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  MonomorphicImpl<const_char_*> *in_RSI;
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  MatcherInterface<const_char_*> *in_stack_ffffffffffffffb8;
  StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *impl;
  
  impl = in_RDI;
  operator_new(0x30);
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::MonomorphicImpl<const_char_*>::MonomorphicImpl(in_RSI,impl);
  Matcher<const_char_*>::Matcher((Matcher<const_char_*> *)in_RDI,in_stack_ffffffffffffffb8);
  return (Matcher<const_char_*> *)impl;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<T>(impl_));
  }